

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::GroupAssignmentRecord
          (GroupAssignmentRecord *this,KUINT32 GroupBitField,EntityIdentifier *ID,KUINT8 DeviceID,
          KUINT8 LineID)

{
  KUINT8 LineID_local;
  KUINT8 DeviceID_local;
  EntityIdentifier *ID_local;
  KUINT32 GroupBitField_local;
  GroupAssignmentRecord *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__GroupAssignmentRecord_0033daf8
  ;
  this->m_ui32GrpBtField = GroupBitField;
  EntityIdentifier::EntityIdentifier(&this->m_Entity,ID);
  this->m_ui16DstCommsDvcID = (ushort)DeviceID;
  this->m_ui8DstLineID = LineID;
  this->m_ui16Padding1 = 0;
  this->m_ui8Padding2 = '\0';
  return;
}

Assistant:

GroupAssignmentRecord::GroupAssignmentRecord( KUINT32 GroupBitField, const EntityIdentifier & ID,
        KUINT8 DeviceID, KUINT8 LineID ) :
    m_ui32GrpBtField( GroupBitField ),
    m_Entity( ID ),
    m_ui16DstCommsDvcID( DeviceID ),
    m_ui8DstLineID( LineID ),
    m_ui16Padding1( 0 ),
    m_ui8Padding2( 0 )
{
}